

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildNode.cpp
# Opt level: O0

FileInfo * __thiscall
llbuild::buildsystem::BuildNode::getFileInfo
          (FileInfo *__return_storage_ptr__,BuildNode *this,FileSystem *fileSystem)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  unsigned_long *puVar4;
  bool local_201;
  string local_1d8;
  char *local_1b8;
  unsigned_long local_1b0;
  char *local_1a8;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 local_178 [8];
  StringRef path;
  FileSystem *fileSystem_local;
  BuildNode *this_local;
  char *local_c0;
  char *local_b8;
  unsigned_long local_b0;
  char *local_a8;
  unsigned_long local_a0;
  undefined1 *local_98;
  undefined1 local_90 [16];
  undefined1 *local_80;
  char **local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  int local_44;
  char *local_40;
  char *local_38;
  iterator local_30;
  int local_24;
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  path.Length = (size_t)fileSystem;
  bVar2 = isVirtual(this);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isVirtual()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildNode.cpp"
                  ,0x8a,
                  "FileInfo llbuild::buildsystem::BuildNode::getFileInfo(basic::FileSystem &) const"
                 );
  }
  _local_178 = Node::getName(&this->super_Node);
  local_188 = "/";
  pcVar3 = (char *)strlen("/");
  local_201 = false;
  if (pcVar3 <= path.Data) {
    local_30 = llvm::StringRef::end((StringRef *)local_178);
    local_30 = local_30 + -(long)pcVar3;
    local_38 = local_188;
    local_40 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = memcmp(local_30,local_188,(size_t)pcVar3);
    }
    local_201 = local_24 == 0;
  }
  bVar2 = false;
  if (local_201) {
    local_198 = (char *)local_178;
    local_190 = path.Data;
    local_1a8 = "/";
    local_68 = (char *)strlen("/");
    local_c0 = local_198;
    local_b8 = local_190;
    local_70 = local_1a8;
    local_78 = &local_c0;
    bVar2 = false;
    if (local_190 == local_68) {
      local_50 = local_198;
      local_58 = local_1a8;
      local_60 = local_68;
      if (local_68 == (char *)0x0) {
        local_44 = 0;
      }
      else {
        local_44 = memcmp(local_198,local_1a8,(size_t)local_68);
      }
      bVar2 = local_44 == 0;
    }
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (bVar2) {
    local_98 = local_178;
    local_a8 = path.Data + -1;
    local_a0 = 0;
    local_80 = local_98;
    puVar4 = std::min<unsigned_long>(&local_a0,(unsigned_long *)&path);
    local_a0 = *puVar4;
    pcVar3 = (char *)((long)local_178 + local_a0);
    local_b0 = (long)path.Data - local_a0;
    puVar4 = std::min<unsigned_long>((unsigned_long *)&local_a8,&local_b0);
    local_1b0 = *puVar4;
    local_10 = local_90;
    path.Data = (char *)local_1b0;
    local_178 = (undefined1  [8])pcVar3;
    local_1b8 = pcVar3;
    local_20 = local_1b0;
    local_18 = pcVar3;
  }
  sVar1 = path.Length;
  llvm::StringRef::operator_cast_to_string(&local_1d8,(StringRef *)local_178);
  (**(code **)(*(long *)sVar1 + 0x38))(__return_storage_ptr__,sVar1,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return __return_storage_ptr__;
}

Assistant:

FileInfo BuildNode::getFileInfo(basic::FileSystem& fileSystem) const {
  assert(!isVirtual());

  // Drop the trailing slash
  // otherwise non-directory paths that end with "/" will be reported as missing
  StringRef path = getName();
  if (path.endswith("/") && path != "/") {
    path = path.substr(0, path.size() - 1);
  }

  return fileSystem.getFileInfo(path);
}